

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

Builder * __thiscall arangodb::velocypack::Builder::operator=(Builder *this,Builder *that)

{
  bool bVar1;
  element_type *peVar2;
  uchar *puVar3;
  Builder *in_RSI;
  Builder *in_RDI;
  Buffer<unsigned_char> *in_stack_00000008;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *in_stack_00000078;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *in_stack_00000080;
  __shared_ptr_access<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffe0;
  
  if (in_RDI != in_RSI) {
    bVar1 = std::operator==((shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *)
                            in_stack_ffffffffffffffe0,in_RDI);
    if (bVar1) {
      std::__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::
      reset((__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *
            )in_RSI);
      in_RDI->_bufferPtr = in_RSI->_bufferPtr;
    }
    else {
      std::
      __shared_ptr_access<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*(in_stack_ffffffffffffffe0);
      std::
      make_shared<arangodb::velocypack::Buffer<unsigned_char>,arangodb::velocypack::Buffer<unsigned_char>&>
                (in_stack_00000008);
      std::shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_>::operator=
                ((shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *)
                 in_stack_ffffffffffffffe0,&in_RDI->_buffer);
      std::shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_>::~shared_ptr
                ((shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *)0x107241);
      peVar2 = std::
               __shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
               ::get((__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                      *)in_RDI);
      in_RDI->_bufferPtr = peVar2;
    }
    if (in_RDI->_bufferPtr == (Buffer<unsigned_char> *)0x0) {
      in_RDI->_start = (uint8_t *)0x0;
    }
    else {
      puVar3 = Buffer<unsigned_char>::data(in_RDI->_bufferPtr);
      in_RDI->_start = puVar3;
    }
    in_RDI->_pos = in_RSI->_pos;
    std::
    vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
    ::operator=(in_stack_00000080,in_stack_00000078);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000080,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000078);
    in_RDI->_keyWritten = (bool)(in_RSI->_keyWritten & 1);
    in_RDI->options = in_RSI->options;
  }
  return in_RDI;
}

Assistant:

Builder& Builder::operator=(Builder const& that) {
  if (this != &that) {
    if (that._buffer == nullptr) {
      _buffer.reset();
      _bufferPtr = that._bufferPtr;
    } else {
      _buffer = std::make_shared<Buffer<uint8_t>>(*that._buffer);
      _bufferPtr = _buffer.get();
    }
    if (_bufferPtr == nullptr) {
      _start = nullptr;
    } else {
      _start = _bufferPtr->data();
    }
    _pos = that._pos;
    _stack = that._stack;
    _indexes = that._indexes;
    _keyWritten = that._keyWritten;
    options = that.options;
  }
  VELOCYPACK_ASSERT(options != nullptr);
  return *this;
}